

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

_Bool intersect_tri3_sphere(vec3_t v0,vec3_t v1,vec3_t v2,vec3_t center,float radius)

{
  undefined8 uVar1;
  segment3_t seg;
  segment3_t seg_00;
  segment3_t seg_01;
  _Bool _Var2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  vec3_t vVar7;
  float local_23c;
  float local_238;
  float local_234;
  float m;
  segment3_t local_1f8;
  undefined8 uStack_1d8;
  float d2;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  segment3_t local_1a8;
  float local_18c;
  undefined8 uStack_188;
  float d1;
  float local_180;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  segment3_t local_158;
  float local_13c;
  undefined8 uStack_138;
  float d0;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined1 local_f8 [8];
  plane_t p;
  float local_e0;
  float local_94;
  float fStack_90;
  vec3_t uvw;
  vec3_t center_local;
  vec3_t v2_local;
  vec3_t v1_local;
  vec3_t v0_local;
  
  fVar6 = center.z;
  uVar5 = center._0_8_;
  fVar4 = v1.z;
  uVar1 = v1._0_8_;
  vVar7 = tri3_get_point_barycentric_coordinates(v0,v1,v2,center);
  local_e0 = vVar7.z;
  fVar3 = local_e0;
  local_94 = vVar7.x;
  unique0x1000057d = vVar7;
  _Var2 = is_in_0_1_range(local_94);
  if (_Var2) {
    fStack_90 = vVar7.y;
    _Var2 = is_in_0_1_range(fStack_90);
    if ((_Var2) && (_Var2 = is_in_0_1_range(fVar3), _Var2)) {
      local_128 = v2._0_8_;
      local_120 = v2.z;
      local_118 = uVar1;
      local_110 = fVar4;
      local_108 = v0._0_8_;
      local_100 = v0.z;
      _local_f8 = tri3_plane(v0,v1,v2);
      uStack_138 = uVar5;
      local_130 = fVar6;
      fVar3 = distance_to_plane(_local_f8,center);
      if (fVar3 <= radius) {
        return true;
      }
      return false;
    }
  }
  local_178 = uVar1;
  local_170 = fVar4;
  local_168 = v0._0_8_;
  local_160 = v0.z;
  segment3(&local_158,v0,v1);
  seg.s.z = local_158.s.z;
  seg.e.x = local_158.e.x;
  seg.s.x = local_158.s.x;
  seg.s.y = local_158.s.y;
  seg.e.y = local_158.e.y;
  seg.e.z = local_158.e.z;
  uStack_188 = uVar5;
  local_180 = fVar6;
  local_13c = distance_to_segment3(seg,center);
  local_1c8 = v2._0_8_;
  local_1c0 = v2.z;
  local_1b8 = uVar1;
  local_1b0 = fVar4;
  segment3(&local_1a8,v1,v2);
  seg_00.s.z = local_1a8.s.z;
  seg_00.e.x = local_1a8.e.x;
  seg_00.s.x = local_1a8.s.x;
  seg_00.s.y = local_1a8.s.y;
  seg_00.e.y = local_1a8.e.y;
  seg_00.e.z = local_1a8.e.z;
  uStack_1d8 = uVar5;
  local_1d0 = fVar6;
  local_18c = distance_to_segment3(seg_00,center);
  segment3(&local_1f8,v2,v0);
  seg_01.s.z = local_1f8.s.z;
  seg_01.e.x = local_1f8.e.x;
  seg_01.s.x = local_1f8.s.x;
  seg_01.s.y = local_1f8.s.y;
  seg_01.e.y = local_1f8.e.y;
  seg_01.e.z = local_1f8.e.z;
  local_23c = distance_to_segment3(seg_01,center);
  local_234 = local_23c;
  if (local_18c < local_23c) {
    local_234 = local_18c;
  }
  if (local_234 <= local_13c) {
    if (local_18c < local_23c) {
      local_23c = local_18c;
    }
    local_238 = local_23c;
  }
  else {
    local_238 = local_13c;
  }
  return local_238 <= radius;
}

Assistant:

bool
intersect_tri3_sphere(vec3_t v0, vec3_t v1, vec3_t v2, vec3_t center, float radius) {
    vec3_t  uvw = tri3_get_point_barycentric_coordinates(v0, v1, v2, center);
    if( is_in_0_1_range(uvw.x) && is_in_0_1_range(uvw.y) && is_in_0_1_range(uvw.z) ) {
        plane_t p   = tri3_plane(v0, v1, v2);
        if( distance_to_plane(p, center) <= radius ) {
            return true;
        } else {
            return false;
        }
    } else {    // point is outside, check the distance from center to segments
        float   d0  = distance_to_segment3(segment3(v0, v1), center);
        float   d1  = distance_to_segment3(segment3(v1, v2), center);
        float   d2  = distance_to_segment3(segment3(v2, v0), center);
        float   m   = MIN(d0, MIN(d1, d2));
        if( m <= radius ) {
            return true;
        } else {
            return false;
        }
    }
}